

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_Look2(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  byte *pbVar1;
  AActor *t1;
  PClass *pPVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  AActor *pAVar6;
  FState *pFVar7;
  char *__assertion;
  AActor *t2;
  bool bVar8;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
LAB_003f3a48:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x925,"int AF_AActor_A_Look2(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003f3a48;
  }
  t1 = (AActor *)(param->field_0).field_1.a;
  if (t1 != (AActor *)0x0) {
    if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
      (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    pPVar5 = (t1->super_DThinker).super_DObject.Class;
    bVar8 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar8) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar8) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f3a48;
    }
  }
  if (((t1->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  t1->threshold = 0;
  pAVar6 = (t1->LastHeard).field_0.p;
  if ((pAVar6 != (AActor *)0x0) &&
     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (t1->LastHeard).field_0.p = (AActor *)0x0;
    pAVar6 = (AActor *)0x0;
  }
  t2 = (AActor *)0x0;
  if ((pAVar6 != (AActor *)0x0) && (0 < pAVar6->health)) {
    t2 = pAVar6;
  }
  if ((t2 != (AActor *)0x0) && (uVar4 = (t2->flags).Value, (uVar4 & 4) != 0)) {
    if (((level.flags._3_1_ & 0x20) == 0) && (((uVar4 ^ (t1->flags).Value) >> 0x1b & 1) == 0)) {
      bVar8 = P_LookForPlayers(t1,(t1->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar8) {
        AActor::SetState(t1,t1->SeeState,false);
        pbVar1 = (byte *)((long)&(t1->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        return 0;
      }
    }
    else if ((((t1->flags).Value & 0x20) == 0) || (bVar8 = P_CheckSight(t1,t2,4), bVar8)) {
      (t1->target).field_0.p = t2;
      t1->threshold = 10;
      pFVar7 = t1->SeeState;
      goto LAB_003f3a1b;
    }
  }
  uVar4 = FRandom::GenRand32(&pr_look2);
  if ((uVar4 & 0xfe) < 0x1e) {
    pFVar7 = t1->SpawnState;
    uVar4 = FRandom::GenRand32(&pr_look2);
    AActor::SetState(t1,pFVar7 + (ulong)(uVar4 & 1) + 1,false);
  }
  if (((t1->flags4).Value & 0x20000) != 0) {
    return 0;
  }
  uVar4 = FRandom::GenRand32(&pr_look2);
  if (0x27 < (uVar4 & 0xf8)) {
    return 0;
  }
  pFVar7 = t1->SpawnState + 3;
LAB_003f3a1b:
  AActor::SetState(t1,pFVar7,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}